

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-combiner.c
# Opt level: O3

void add_vec(int n,int *vals,int *auxs,int *accum,int *accum_aux)

{
  int iVar1;
  ulong uVar2;
  
  if (n < 1) {
    *accum = 0x7ffffffe;
    iVar1 = 0x7ffffffe;
  }
  else {
    *accum = *vals;
    if (n != 1) {
      uVar2 = 1;
      do {
        add_combine_accum_help(vals[uVar2],accum);
        uVar2 = uVar2 + 1;
      } while ((uint)n != uVar2);
      if (n < 1) {
        *accum_aux = 0x7ffffffe;
      }
      else {
        *accum_aux = *auxs;
        if (n == 1) {
          return;
        }
      }
      uVar2 = 1;
      do {
        add_combine_accum_help(auxs[uVar2],accum_aux);
        uVar2 = uVar2 + 1;
      } while ((uint)n != uVar2);
      return;
    }
    iVar1 = *auxs;
  }
  *accum_aux = iVar1;
  return;
}

Assistant:

static void add_vec(int n, const int *vals, const int *auxs,
	int *accum, int *accum_aux)
{
	int i;

	*accum = (n > 0) ? vals[0] : UI_ENTRY_VALUE_NOT_PRESENT;
	for (i = 1; i < n; ++i) {
		add_combine_accum_help(vals[i], accum);
	}

	*accum_aux = (n > 0) ? auxs[0] : UI_ENTRY_VALUE_NOT_PRESENT;
	for (i = 1; i < n; ++i) {
		add_combine_accum_help(auxs[i], accum_aux);
	}
}